

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_vstat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *choppedarg;
  char arg [4608];
  CHAR_DATA *in_stack_00001210;
  char *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffede8,"mob");
    if (bVar1) {
      bVar1 = str_cmp(&stack0xffffffffffffede8,"obj");
      if (bVar1) {
        do_vostat(in_stack_00001210,(char *)arg._4600_8_);
      }
      else {
        do_vostat(in_stack_00001210,(char *)arg._4600_8_);
      }
    }
    else {
      do_vmstat((CHAR_DATA *)arg._4576_8_,(char *)arg._4568_8_);
    }
  }
  return;
}

Assistant:

void do_vstat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *choppedarg;
	choppedarg = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  vstat mob [vnum]\n\r", ch);
		send_to_char("  vstat obj [vnum]\n\r", ch);
		send_to_char("Default is obj.\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "mob"))
	{
		do_vmstat(ch, choppedarg);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_vostat(ch, choppedarg);
		return;
	}

	/* default = obj */
	do_vostat(ch, argument);
}